

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_set.c
# Opt level: O2

int mpt_meta_set(mpt_metatype **mptr,mpt_value *val)

{
  mpt_metatype *pmVar1;
  int iVar2;
  int iVar3;
  mpt_metatype *pmVar4;
  mpt_value tmp;
  mpt_config *cfg;
  mpt_object *obj;
  
  pmVar1 = *mptr;
  if (pmVar1 == (mpt_metatype *)0x0) {
    if (val != (mpt_value *)0x0) goto LAB_00114bb7;
    tmp._addr = (void *)0x0;
  }
  else {
    iVar2 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0,(void *)0x0);
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    obj = (mpt_object *)0x0;
    iVar2 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0x84,&obj);
    if (obj != (mpt_object *)0x0 && -1 < iVar2) {
      if (val != (mpt_value *)0x0) {
        tmp._addr = val->_addr;
        tmp._type = val->_type;
        iVar2 = mpt_object_set_value(obj,(char *)0x0,&tmp);
        if (-1 < iVar2) {
          return iVar3;
        }
        return iVar2;
      }
      iVar2 = (*obj->_vptr->set_property)(obj,(char *)0x0,(mpt_convertable *)0x0);
      if (-1 < iVar2) {
        return iVar3;
      }
    }
    cfg = (mpt_config *)0x0;
    iVar2 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0x85,&cfg);
    if ((-1 < iVar2 && cfg != (mpt_config *)0x0) &&
       (iVar3 = (*cfg->_vptr->assign)(cfg,(mpt_path *)0x0,val), -1 < iVar3)) {
      return iVar3;
    }
    if (val != (mpt_value *)0x0) {
LAB_00114bb7:
      pmVar4 = mpt_meta_new(val);
      if (pmVar4 == (mpt_metatype *)0x0) {
        return -4;
      }
      iVar2 = (*(pmVar4->_vptr->convertable).convert)((mpt_convertable *)pmVar4,0,(void *)0x0);
      iVar3 = 0;
      if (0 < iVar2) {
        iVar3 = iVar2;
      }
      goto LAB_00114c29;
    }
    tmp._addr = (void *)0x0;
    iVar2 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0x86,&tmp);
    if ((tmp._addr != (void *)0x0 && -1 < iVar2) &&
       (iVar2 = (**(code **)(*tmp._addr + 0x10))(), -1 < iVar2)) {
      return iVar3;
    }
  }
  pmVar4 = mpt_metatype_default();
  iVar3 = 0;
LAB_00114c29:
  if (pmVar1 != (mpt_metatype *)0x0) {
    (*pmVar1->_vptr->unref)(pmVar1);
  }
  *mptr = pmVar4;
  return iVar3;
}

Assistant:

extern int mpt_meta_set(MPT_INTERFACE(metatype) **mptr, const MPT_STRUCT(value) *val)
{
	
	MPT_INTERFACE(metatype) *old, *mt;
	int ret = 0;
	
	if ((old = *mptr)) {
		/* try assign existing data */
		MPT_INTERFACE(object) *obj;
		MPT_INTERFACE(config) *cfg;
		
		if ((ret = MPT_metatype_convert(old, 0, 0)) < 0) {
			ret = 0;
		}
		obj = 0;
		if ((MPT_metatype_convert(old, MPT_ENUM(TypeObjectPtr), &obj)) >= 0
		 && obj) {
			int err;
			if (val) {
				MPT_STRUCT(value) tmp = *val;
				if ((err = mpt_object_set_value(obj, 0, &tmp)) < 0) {
					return err;
				}
				return ret;
			}
			if ((err = obj->_vptr->set_property(obj, 0, 0)) >= 0) {
				return ret;
			}
		}
		cfg = 0;
		if ((MPT_metatype_convert(old, MPT_ENUM(TypeConfigPtr), &cfg)) >= 0
		    && cfg
		    && (ret = cfg->_vptr->assign(cfg, 0, val)) >= 0) {
			return ret;
		}
	}
	/* default config data */
	if (!val) {
		/* try to reset existing iterator */
		MPT_INTERFACE(iterator) *it = 0;
		
		if (old
		    && MPT_metatype_convert(old, MPT_ENUM(TypeIteratorPtr), &it) >= 0
		    && it
		    && it->_vptr->reset(it) >= 0) {
			return ret;
		}
		mt = mpt_metatype_default();
		ret = 0;
	}
	/* create new metatype for data */
	else if (!(mt = mpt_meta_new(val))) {
		return MPT_ERROR(BadOperation);
	}
	else if ((ret = MPT_metatype_convert(mt, 0, 0)) < 0) {
		ret = 0;
	}
	if (old) {
		old->_vptr->unref(old);
	}
	*mptr = mt;
	return ret;
}